

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Division.h
# Opt level: O1

ptr<Value> __thiscall Division::asDoubles(Division *this,double leftOperand,double rightOperand)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  _func_int **pp_Var1;
  ptr<Value> pVar2;
  
  pp_Var1 = (_func_int **)operator_new(0x20);
  pp_Var1[1] = (_func_int *)0x100000001;
  *pp_Var1 = (_func_int *)&PTR___Sp_counted_ptr_inplace_0012f488;
  pp_Var1[2] = (_func_int *)&PTR__Member_0012f4d8;
  pp_Var1[3] = (_func_int *)(leftOperand / rightOperand);
  (this->super_Operation)._vptr_Operation = pp_Var1 + 2;
  this[1].super_Operation._vptr_Operation = pp_Var1;
  pVar2.super___shared_ptr<Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&PTR__Member_0012f4d8;
  pVar2.super___shared_ptr<Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (ptr<Value>)pVar2.super___shared_ptr<Value,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ptr<Value> asDoubles(double leftOperand, double rightOperand) override {
        return make<Double>(leftOperand / rightOperand);
    }